

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorGlobalState::PatchPrevIdcs
          (WindowDistinctAggregatorGlobalState *this)

{
  size_type __n;
  long lVar1;
  reference this_00;
  pointer ptVar2;
  reference pvVar3;
  ulong uVar4;
  long lVar5;
  
  this_00 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::operator[](&(this->zipped_tree).tree,0);
  ptVar2 = (this->seconds).
           super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           .
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(this->seconds).
                           super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                           .
                           super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2)) {
    uVar4 = 1;
    lVar5 = 0;
    do {
      __n = *(size_type *)
             ((long)&ptVar2[1].super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                     super__Head_base<0UL,_unsigned_long,_false> + lVar5);
      pvVar3 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                         (&this_00->first,__n);
      if ((pvVar3->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl != 0) {
        ptVar2 = (this->seconds).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->seconds).
                          super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                          .
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2 >> 4) <=
            uVar4 - 1) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        lVar1 = *(long *)((long)&(ptVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
                                 super__Tuple_impl<1UL,_unsigned_long> + lVar5);
        pvVar3 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                           (&this_00->first,__n);
        (pvVar3->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = lVar1 + 1;
        (pvVar3->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
        super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = __n;
      }
      uVar4 = uVar4 + 1;
      ptVar2 = (this->seconds).
               super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               .
               super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(this->seconds).
                                   super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                                   .
                                   super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2 >> 4));
  }
  return;
}

Assistant:

void WindowDistinctAggregatorGlobalState::PatchPrevIdcs() {
	//	13:	return prevIdcs

	// Patch up the indices at block boundaries
	// (We don't need to patch block 0.)
	auto &prev_idcs = zipped_tree.LowestLevel();
	for (idx_t block_idx = 1; block_idx < seconds.size(); ++block_idx) {
		// We only need to patch if the first index in the block
		// was a back link to the previous block (10:)
		auto i = std::get<0>(seconds.at(block_idx));
		if (std::get<0>(prev_idcs[i])) {
			auto second = std::get<1>(seconds.at(block_idx - 1));
			prev_idcs[i] = ZippedTuple(second + 1, i);
		}
	}
}